

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  FP *val2;
  FP *val2_00;
  FP *pFVar1;
  AssertionResult *pAVar2;
  AssertionResult *this_00;
  char *pcVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  AssertHelper local_a8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  double local_80;
  MomentumType local_78;
  ParticleType particle;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this);
  local_78.x = 541200.0;
  local_78.y = -5.4363;
  local_78.z = 64316500.0;
  pica::Particle<(pica::Dimension)2>::setMomentum(&particle,&local_78);
  val2 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
          super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
          maxRelativeError;
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  dVar4 = SQRT(local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y);
  val2_00 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
             super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
             maxAbsoluteError;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
            maxAbsoluteError;
  if (dVar4 < *pFVar1 || dVar4 == *pFVar1) {
    pica::Particle<(pica::Dimension)2>::getMomentum(&particle);
    dVar4 = local_78.x - (double)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_);
    local_a8.data_ =
         (AssertHelperData *)
         SQRT((local_78.z - local_80) * (local_78.z - local_80) +
              dVar4 * dVar4 +
              (local_78.y - (double)gtest_ar_2.message_.ptr_) *
              (local_78.y - (double)gtest_ar_2.message_.ptr_));
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,"dist(newMomentum, particle.getMomentum())",
               "this->maxAbsoluteError",(double *)&local_a8,val2_00);
    if (gtest_ar.success_ != false) goto LAB_00195e61;
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
LAB_0019603d:
    pAVar2 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    this_00 = &gtest_ar_2;
  }
  else {
    pica::Particle<(pica::Dimension)2>::getMomentum(&particle);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_78.x;
    dVar4 = local_78.x - (double)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_);
    auVar6._8_8_ = local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y;
    auVar6._0_8_ = (local_78.z - local_80) * (local_78.z - local_80) +
                   dVar4 * dVar4 +
                   (local_78.y - (double)gtest_ar_2.message_.ptr_) *
                   (local_78.y - (double)gtest_ar_2.message_.ptr_);
    auVar6 = sqrtpd(auVar5,auVar6);
    local_a8.data_ = (AssertHelperData *)(auVar6._0_8_ / auVar6._8_8_);
    testing::internal::CmpHelperLE<double,double>
              ((internal *)&gtest_ar,
               "dist(newMomentum, particle.getMomentum()) / newMomentum.norm()",
               "this->maxRelativeError",(double *)&local_a8,val2);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x88,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar_2);
      goto LAB_0019603d;
    }
LAB_00195e61:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    dVar4 = *(double *)(pica::ParticleTypes::types + (long)particle.typeIndex * 0x10) *
            29979245800.0;
    dVar4 = SQRT((local_78.z * local_78.z + local_78.x * local_78.x + local_78.y * local_78.y) /
                 (dVar4 * dVar4) + 1.0);
    if (ABS(dVar4) < *val2_00 || ABS(dVar4) == *val2_00) {
      gtest_ar._0_8_ = ABS(dVar4 + -1.0 / particle.invGamma);
      testing::internal::CmpHelperLE<double,double>
                ((internal *)&gtest_ar_2,"fabs(expectedGamma - particle.getGamma())",
                 "this->maxAbsoluteError",(double *)&gtest_ar,val2_00);
      if (gtest_ar_2.success_ != false) goto LAB_00195fbb;
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x8a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar);
    }
    else {
      gtest_ar._0_8_ = ABS((-1.0 / particle.invGamma + dVar4) / dVar4);
      testing::internal::CmpHelperLE<double,double>
                ((internal *)&gtest_ar_2,
                 "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
                 "this->maxRelativeError",(double *)&gtest_ar,val2);
      if (gtest_ar_2.success_ != false) {
LAB_00195fbb:
        pAVar2 = &gtest_ar_2;
        goto LAB_001960c3;
      }
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x8a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar);
    }
    pAVar2 = &gtest_ar_2;
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    this_00 = &gtest_ar;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_001960c3:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar2->message_);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetMomentum)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    MomentumType newMomentum(54.12e+4, -543.63e-2, 643.165e5);
    particle.setMomentum(newMomentum);
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_VECTOR(newMomentum, particle.getMomentum());
    GammaType expectedGamma = sqrt((FP)1 + newMomentum.norm2() / sqr(particle.getMass() * Constants<GammaType >::c()));
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}